

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_pred.hpp
# Opt level: O3

AssertionResult * __thiscall
iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
          (AssertionResult *__return_storage_ptr__,iutest *this,char *pred_str,char *params,
          _func_bool_int_int_int_int_int_int *pred,int args,int args_1,int args_2,int args_3,
          int args_4,int args_5)

{
  pointer pcVar1;
  char cVar2;
  AssertionResult *pAVar3;
  int in_stack_ffffffffffffff68;
  int args_local;
  AssertionResult *local_90;
  char *params_local;
  char *pred_str_local;
  AssertionResult local_78;
  string local_50;
  
  args_local = (int)pred;
  params_local = pred_str;
  pred_str_local = (char *)this;
  cVar2 = (*(code *)params)((ulong)pred & 0xffffffff,args,args_1,args_2,args_3,args_4);
  if (cVar2 == '\0') {
    local_78.m_message._M_dataplus._M_p = (pointer)&local_78.m_message.field_2;
    local_78.m_message._M_string_length = 0;
    local_78.m_message.field_2._M_local_buf[0] = '\0';
    local_78.m_result = false;
    pAVar3 = AssertionResult::operator<<(&local_78,(char (*) [8])"error: ");
    pAVar3 = AssertionResult::operator<<(pAVar3,&pred_str_local);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x3381cc);
    pAVar3 = AssertionResult::operator<<(pAVar3,&params_local);
    pAVar3 = AssertionResult::operator<<(pAVar3,(char (*) [29])") evaluates to false, where ");
    local_90 = AssertionResult::operator<<(pAVar3,(char (*) [2])0x32df26);
    PrintToStrings<int,int,int,int,int,int>
              (&local_50,(iutest *)0x32df26,(char *)&args_local,(int *)(ulong)(uint)args,args_1,
               args_2,args_3,args_4,in_stack_ffffffffffffff68);
    pAVar3 = AssertionResult::operator<<(local_90,&local_50);
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    pcVar1 = (pAVar3->m_message)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + (pAVar3->m_message)._M_string_length
              );
    __return_storage_ptr__->m_result = pAVar3->m_result;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.m_message._M_dataplus._M_p != &local_78.m_message.field_2) {
      operator_delete(local_78.m_message._M_dataplus._M_p,
                      CONCAT71(local_78.m_message.field_2._M_allocated_capacity._1_7_,
                               local_78.m_message.field_2._M_local_buf[0]) + 1);
    }
  }
  else {
    (__return_storage_ptr__->m_message)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_message).field_2;
    (__return_storage_ptr__->m_message)._M_string_length = 0;
    (__return_storage_ptr__->m_message).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->m_result = true;
  }
  return __return_storage_ptr__;
}

Assistant:

AssertionResult AssertPredVariadicHelper(const char* pred_str, const char* params
    , PRED pred, Args... args)
{
    if IUTEST_COND_LIKELY( (*pred)(args...) )
    {
        return AssertionSuccess();
    }
    return AssertionFailure() << "error: " << pred_str << "("
        << params << ") evaluates to false, where "
        << "\n" << PrintToStrings("\n", args...);
}